

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void interpreter(str *program,str *input,ostream *out,ostream *err)

{
  s_i raw;
  ostream *this;
  pointer pDVar1;
  encoding_t eVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined4 extraout_var;
  int *piVar7;
  cg_box *pcVar8;
  bool bVar9;
  bool empty;
  parse_exc e;
  s_i body;
  bool local_1d5;
  encoding_t local_1d4;
  ulong local_1d0;
  undefined8 local_1c8;
  ostream *local_1c0;
  int local_1b4;
  undefined8 local_1b0;
  cg_box *local_1a8;
  str *local_1a0;
  P_Sequence *local_198;
  ostream *local_190;
  vector<Direction,_std::allocator<Direction>_> local_188;
  undefined1 local_170 [16];
  int *local_160;
  point local_148;
  point pStack_140;
  int local_138;
  vector<int,_std::allocator<int>_> local_130;
  cg_box *local_118;
  cg_box *pcStack_110;
  pointer local_108;
  point local_f0;
  point pStack_e8;
  int local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  str *local_b8;
  undefined1 uStack_b0;
  undefined7 uStack_af;
  char *local_a8;
  State local_a0;
  s_i local_48;
  
  local_1c0 = err;
  local_190 = out;
  eVar2 = detect_encoding(program);
  local_1c8 = 0;
  uVar6 = std::__cxx11::string::find((char)program,10);
  local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170._0_4_ = 1;
  local_170._4_4_ = 0;
  std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
            (&local_188,(point *)local_170);
  piVar7 = (int *)(program->_M_dataplus)._M_p;
  local_1d4 = eVar2;
  if (uVar6 == 0xffffffffffffffff) {
LAB_00107bbd:
    local_1a8 = (cg_box *)0x0;
    local_1b0 = 0;
    bVar9 = true;
    iVar5 = -0x80000000;
    local_1d0 = 0;
  }
  else {
    local_170[8] = eVar2 == ENC_UTF8;
    local_170._0_8_ = program;
    local_160 = piVar7;
    if (uVar6 == 0) {
      local_1c8 = 0;
      goto LAB_00107bbd;
    }
    iVar5 = -0x80000000;
    local_198 = (P_Sequence *)CONCAT44(local_198._4_4_,1);
    local_1d0 = 0;
    local_1c8 = 0;
    local_1a8 = (cg_box *)0x0;
    local_1b0 = 0;
    local_1a0 = input;
    do {
      iVar3 = s_i::get((s_i *)local_170);
      if (iVar3 < 0x4d) {
        if (iVar3 - 0x3fU < 8) {
          switch(iVar3) {
          case 0x3f:
            local_1c8 = 1;
            break;
          default:
switchD_001079df_caseD_40:
            bVar9 = is_dir_inst(iVar3,false);
            if (bVar9) {
              local_160 = (int *)((long)local_160 + -1);
              read_dirs((vector<Direction,_std::allocator<Direction>_> *)&local_118,(s_i *)local_170
                        ,false);
              pDVar1 = local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_118;
              local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)pcStack_110;
              local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = local_108;
              local_118 = (cg_box *)0x0;
              pcStack_110 = (cg_box *)0x0;
              local_108 = (pointer)0x0;
              if (((cg_box *)pDVar1 != (cg_box *)0x0) &&
                 (operator_delete(pDVar1), local_118 != (cg_box *)0x0)) {
                operator_delete(local_118);
              }
            }
            else {
              iVar4 = isspace(iVar3);
              this = local_1c0;
              if (iVar4 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_1c0,"Unrecognized option: ",0x15);
                std::ostream::operator<<(this,iVar3);
                goto LAB_00107cc4;
              }
            }
            break;
          case 0x41:
            local_1b0 = CONCAT71((int7)((ulong)((long)&switchD_001079df::switchdataD_0010e080 +
                                               (long)(int)(&switchD_001079df::switchdataD_0010e080)
                                                          [iVar3 - 0x3fU]) >> 8),1);
            break;
          case 0x45:
            iVar5 = s_i::get((s_i *)local_170);
            break;
          case 0x46:
            iVar5 = 0x20;
          }
        }
        else if (iVar3 == 0x26) {
          local_1c8 = 2;
        }
        else {
          if ((iVar3 != 0x2c) || (iVar4 = s_i::peek((s_i *)local_170,0), iVar4 != 0x2c))
          goto switchD_001079df_caseD_40;
          skip_comment((s_i *)local_170);
        }
      }
      else if (iVar3 == 0x4d) {
        local_1a8 = (cg_box *)CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
      }
      else if (iVar3 == 0x52) {
        local_1d0 = 1;
      }
      else {
        if (iVar3 != 0x5e) goto switchD_001079df_caseD_40;
        local_198 = (P_Sequence *)((ulong)local_198 & 0xffffffff00000000);
      }
    } while ((ulong)((long)local_160 - *(long *)local_170._0_8_) < uVar6);
    piVar7 = (int *)(program->_M_dataplus)._M_p;
    bVar9 = (int)local_198 == 1;
    input = local_1a0;
  }
  eVar2 = local_1d4;
  local_48.utf8 = local_1d4 == ENC_UTF8;
  local_48.i = (char *)((long)piVar7 + uVar6 + 1);
  local_48.s = program;
  local_198 = parse(&local_48);
  if (eVar2 == ENC_SINGLE_BYTE) {
    uStack_b0 = false;
  }
  else {
    eVar2 = detect_encoding(input);
    uStack_b0 = eVar2 != ENC_SINGLE_BYTE;
  }
  local_a8 = (input->_M_dataplus)._M_p;
  raw._9_7_ = uStack_af;
  raw.utf8 = (bool)uStack_b0;
  raw.s = input;
  raw.i = local_a8;
  local_b8 = input;
  Grid::Grid((Grid *)&local_118,raw,10,(int)local_1d0,iVar5,&local_1d5);
  State::State((State *)local_170,(Grid *)&local_118,(bool)((byte)local_1a8 & 1));
  Grid::~Grid((Grid *)&local_118);
  if (((int)local_1c8 == 2 & local_1d5) == 1) {
    std::ostream::operator<<(local_190,1);
    goto LAB_00107ca5;
  }
  local_1b4 = 1;
  local_1a0 = (str *)CONCAT44(local_1a0._4_4_,1);
  if (bVar9) {
    iVar5 = Grid::bWidth((Grid *)local_170);
    local_1a0 = (str *)CONCAT44(local_1a0._4_4_,iVar5);
    local_1b4 = Grid::bHeight((Grid *)local_170);
    if (0 < local_1b4) goto LAB_00107d27;
    local_1d4 = ENC_ASCII;
  }
  else {
LAB_00107d27:
    local_1d0 = local_1d0 & 0xffffffff00000000;
    local_1b0 = CONCAT44(local_1b0._4_4_,(uint)(byte)local_1b0) & 0xffffffff00000001;
    local_1d4 = ENC_ASCII;
    do {
      if (0 < (int)local_1a0) {
        iVar5 = 0;
        do {
          local_1a8 = (cg_box *)
                      local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          pcVar8 = (cg_box *)
                   local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              Grid::Grid((Grid *)&local_118,(Grid *)local_170);
              local_e0 = local_138;
              local_f0 = local_148;
              pStack_e8 = pStack_140;
              std::vector<int,_std::allocator<int>_>::vector(&local_d8,&local_130);
              local_f0.x = pcVar8->h;
              local_f0.y = *(int *)&pcVar8->data;
              pStack_e8.y = (int)local_1d0;
              pStack_e8.x = iVar5;
              Grid::Grid(&local_a0.cg,(Grid *)&local_118);
              local_a0.flags = local_e0;
              local_a0.direction = local_f0;
              local_a0.position = pStack_e8;
              std::vector<int,_std::allocator<int>_>::vector(&local_a0.qcount,&local_d8);
              iVar3 = match(&local_a0,local_198,SUB81(local_1b0,0));
              if (local_a0.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_a0.qcount.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              Grid::~Grid(&local_a0.cg);
              if (iVar3 < 1) {
                if (iVar3 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1c0,"Stack Overflow\n",0xf);
                  goto LAB_00107e8b;
                }
                bVar9 = true;
                iVar4 = 0;
                if ((int)local_1c8 == 2) goto LAB_00107e69;
              }
              else {
                iVar4 = 1;
                if ((int)local_1c8 == 1) {
LAB_00107e69:
                  std::ostream::operator<<(local_190,iVar4);
LAB_00107e8b:
                  bVar9 = false;
                }
                else {
                  local_1d4 = local_1d4 + iVar3;
                  bVar9 = true;
                }
              }
              if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              Grid::~Grid((Grid *)&local_118);
              if (!bVar9) goto LAB_00107ca5;
              pcVar8 = (cg_box *)((long)&pcVar8->data + 4);
            } while (pcVar8 != local_1a8);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != (int)local_1a0);
      }
      iVar5 = (int)local_1d0 + 1;
      local_1d0 = CONCAT44(local_1d0._4_4_,iVar5);
    } while (iVar5 != local_1b4);
  }
  eVar2 = ENC_UTF8;
  if ((int)local_1c8 != 2) {
    eVar2 = local_1d4;
  }
  std::ostream::operator<<(local_190,eVar2);
LAB_00107ca5:
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Grid::~Grid((Grid *)local_170);
LAB_00107cc4:
  if ((cg_box *)
      local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start != (cg_box *)0x0) {
    operator_delete(local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void interpreter(const str &program, const str &input, std::ostream &out, std::ostream &err) {
    encoding_t progEnc = detect_encoding(program);
    size_t nl = program.find('\n');
    m_just just = M_JUST_LEFT; m_start start = M_START_ALLBOX; m_type type = M_TYPE_COUNT;
    int chfill = OUT_CHAR;
    bool mobile = false, allpaths = false;
    vector<Direction> dirs;
    dirs.emplace_back( point{ 1, 0 } );

    if (~nl) {
        s_i o{ program, progEnc == ENC_UTF8 };
        for (int c; o.ind() < nl; ) {
            c = o.get();
            if (c == INST_OPTION_TYPE_BOOLEAN) type = M_TYPE_BOOLEAN;
            else if (c == INST_OPTION_TYPE_ALL) type = M_TYPE_ALL;
            else if (c == INST_OPTION_RJUST) just = M_JUST_RIGHT;
            else if (c == INST_OPTION_START_TOPLEFT) start = M_START_TOPLEFT;
            else if (c == INST_OPTION_FILL_SPACE) chfill = ' ';
            else if (c == INST_OPTION_FILL_CHAR) chfill = o.get();
            else if (c == INST_OPTION_MOBILE_START) mobile = true;
            else if (c == INST_OPTION_ALL_PATHS) allpaths = true;
            else if (c == INST_QUANTIFIER_RANGE_OR_LINE_COMMENT && o.peek() == INST_QUANTIFIER_RANGE_OR_LINE_COMMENT) skip_comment(o);
            else if (is_dir_inst(c, false)) {
                o.back();
                dirs = read_dirs(o, false);
            } else if (!isspace(c)) {
                err << "Unrecognized option: " << c;
                return;
            }
        }
    }

    s_i body{ program, progEnc == ENC_UTF8, nl + 1 };
    P_Sequence *pat;
    try {
        pat = parse(body);
    } catch (parse_exc e) {
        err << "Parse error: " << e.what();
        if (~e.i) err << " at position " << e.i;
        err << std::endl;
        return;
    }
    bool empty;
    State global(Grid{ s_i{ input, progEnc != ENC_SINGLE_BYTE && detect_encoding(input) != ENC_SINGLE_BYTE },
        '\n', just, chfill, empty }, mobile);
    if (empty && type == M_TYPE_ALL) {
        out << 1;
        return;
    }

    int nmatch = 0;

    int xmax = start == M_START_ALLBOX ? global.cg.bWidth() : 1;
    int ymax = start == M_START_ALLBOX ? global.cg.bHeight() : 1;
    for (int y = 0; y < ymax; y++) {
        for (int x = 0; x < xmax; x++) {
            for (Direction &d : dirs) {
                State local{ global };
                local.direction = d.absdir();
                local.position = { x, y };
                int mr = match(local, pat, allpaths);
                if (mr > 0) {
                    if (type == M_TYPE_BOOLEAN) {
                        out << 1;
                        return;
                    }
                    nmatch += mr;
                } else if (mr == MATCH_RESULT_OVERFLOW) {
                    err << "Stack Overflow\n";
                    return;
                } else if (type == M_TYPE_ALL) {
                    out << 0;
                    return;
                }
            }
        }
    }
    if (type == M_TYPE_ALL) {
        out << 1;
    } else {
        out << nmatch;
    }
}